

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O0

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,size_t nb_files,char **file_name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  CaptureSummary **cs;
  ulong uVar4;
  ulong *puVar5;
  CaptureSummary *this_00;
  CaptureSummary *pCVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  bool local_89;
  CaptureSummary *local_78;
  ulong local_50;
  size_t i_1;
  size_t i;
  bool ret;
  CaptureSummary *baselist;
  CaptureSummary **list;
  char **file_name_local;
  size_t nb_files_local;
  CaptureSummary *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = nb_files + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  cs = (CaptureSummary **)operator_new__(uVar3);
  uVar3 = nb_files + 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  uVar4 = SUB168(auVar2 * ZEXT816(0x20),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar2 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  pCVar6 = (CaptureSummary *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_78 = pCVar6;
    do {
      CaptureSummary(local_78);
      local_78 = local_78 + 1;
    } while (local_78 != pCVar6 + uVar3);
  }
  bVar8 = cs != (CaptureSummary **)0x0;
  bVar9 = pCVar6 != (CaptureSummary *)0x0;
  local_89 = bVar8 && bVar9;
  i._3_1_ = local_89;
  if (bVar8 && bVar9) {
    for (i_1 = 0; (bVar8 && bVar9) && i_1 < nb_files; i_1 = i_1 + 1) {
      cs[i_1] = pCVar6 + i_1;
    }
  }
  for (local_50 = 0; i._3_1_ != false && local_50 < nb_files; local_50 = local_50 + 1) {
    i._3_1_ = Load(cs[local_50],file_name[local_50]);
  }
  if (i._3_1_ != false) {
    i._3_1_ = Merge(this,nb_files,cs);
  }
  if ((pCVar6 != (CaptureSummary *)0x0) && (pCVar6 != (CaptureSummary *)0x0)) {
    this_00 = pCVar6 + *puVar5;
    while (pCVar6 != this_00) {
      this_00 = this_00 + -1;
      ~CaptureSummary(this_00);
    }
    operator_delete__(puVar5);
  }
  if ((cs != (CaptureSummary **)0x0) && (cs != (CaptureSummary **)0x0)) {
    operator_delete__(cs);
  }
  return i._3_1_;
}

Assistant:

bool CaptureSummary::Merge(size_t nb_files, char const ** file_name)
{
    CaptureSummary ** list = new  CaptureSummary*[nb_files + 1];
    CaptureSummary * baselist = new  CaptureSummary[nb_files + 1];

    bool ret = list != NULL && baselist != NULL;

    if (ret)
    {
        for (size_t i = 0; ret && i < nb_files; i++)
        {
            list[i] = &baselist[i];
        }
    }

    for (size_t i=0; ret && i < nb_files; i++)
    {
        ret = list[i]->Load(file_name[i]);
    }

    if (ret)
    {
        ret = Merge(nb_files, list);
    }

    if (baselist != NULL)
    {
        delete[] baselist;
    }

    if (list != NULL)
    {
        delete[] list;
    }

    return ret;
}